

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O1

_Bool project_f(source origin,wchar_t r,loc grid,wchar_t dam,wchar_t typ)

{
  project_feature_handler_context_t local_28;
  
  local_28.origin.which = origin.which;
  local_28.origin.what = origin.what;
  local_28.obvious = false;
  if (typ != L'>') {
    local_28.r = r;
    local_28.grid = grid;
    local_28.dam = dam;
    local_28.type = typ;
    (*feature_handlers[typ])(&local_28);
  }
  return local_28.obvious;
}

Assistant:

bool project_f(struct source origin, int r, struct loc grid, int dam, int typ)
{
	bool obvious = false;

	project_feature_handler_context_t context = {
		origin,
		r,
		grid,
		dam,
		typ,
		obvious,
	};
	project_feature_handler_f feature_handler = feature_handlers[typ];

	if (feature_handler != NULL)
		feature_handler(&context);

	/* Return "Anything seen?" */
	return context.obvious;
}